

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

bool Js::JavascriptStringHelpers<Js::JavascriptString>::Equals
               (JavascriptString *aLeft,JavascriptString *aRight)

{
  int iVar1;
  char16 *string1;
  char16 *string2;
  bool bVar2;
  
  bVar2 = true;
  if (aLeft != aRight) {
    if (aLeft->m_charLength == aRight->m_charLength) {
      string1 = JavascriptString::GetString(aLeft);
      string2 = JavascriptString::GetString(aRight);
      if (string1 != string2) {
        iVar1 = PAL_wmemcmp(string1,string2,(ulong)aLeft->m_charLength);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool JavascriptStringHelpers<T>::Equals(T* aLeft, T* aRight)
    {
        if (aLeft == aRight) return true;

        // methods could get called a lot of times this can show up as regressions in benchmarks.
        volatile T** keepAliveLeftString = (volatile T**)& aLeft;
        volatile T** keepAliveRightString = (volatile T**)& aRight;
        auto keepAliveLambda = [&]() {
            UNREFERENCED_PARAMETER(keepAliveLeftString);
            UNREFERENCED_PARAMETER(keepAliveRightString);
        };

        if (aLeft->GetLength() != aRight->GetLength())
        {
            return false;
        }

        return JsUtil::CharacterBuffer<char16>::StaticEquals(aLeft->GetString(), aRight->GetString(), aLeft->GetLength());
    }